

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

void __thiscall CVmImageLoader::load_sini(CVmImageLoader *this,ulong siz)

{
  unsigned_long uVar1;
  ulong uVar2;
  CVmStaticInitPage *this_00;
  char *pcVar3;
  long in_RSI;
  undefined8 *in_RDI;
  CVmStaticInitPage *pg;
  size_t cur;
  ulong init_rem;
  ulong init_cnt;
  ulong hdr_siz;
  ulong siz_rem;
  char hdr [12];
  size_t local_48;
  ulong local_40;
  long local_28;
  undefined1 local_1c [4];
  undefined1 auStack_18 [4];
  undefined1 auStack_14 [4];
  long local_10;
  
  local_10 = in_RSI;
  (**(code **)(*(long *)*in_RDI + 0x18))((long *)*in_RDI,local_1c,0xc);
  uVar1 = ::osrp4(local_1c);
  uVar2 = uVar1 & 0xffffffff;
  uVar1 = ::osrp4(auStack_18);
  in_RDI[0x11] = uVar1 & 0xffffffff;
  uVar1 = ::osrp4(auStack_14);
  local_40 = uVar1 & 0xffffffff;
  if (0xc < uVar2) {
    (**(code **)(*(long *)*in_RDI + 0x48))((long *)*in_RDI,uVar2 - 0xc);
  }
  local_28 = local_10 - uVar2;
  for (; local_40 != 0; local_40 = local_40 - local_48) {
    local_48 = 1000;
    if (local_40 < 1000) {
      local_48 = local_40;
    }
    this_00 = (CVmStaticInitPage *)operator_new(0x18);
    CVmStaticInitPage::CVmStaticInitPage(this_00,local_48);
    if (in_RDI[0x10] == 0) {
      in_RDI[0xf] = this_00;
    }
    else {
      *(CVmStaticInitPage **)in_RDI[0x10] = this_00;
    }
    in_RDI[0x10] = this_00;
    pcVar3 = (char *)(**(code **)(*(long *)*in_RDI + 0x20))((long *)*in_RDI,local_48 * 6,0,local_28)
    ;
    this_00->data_ = pcVar3;
    local_28 = local_28 + local_48 * -6;
  }
  if (local_28 != 0) {
    (**(code **)(*(long *)*in_RDI + 0x48))((long *)*in_RDI,local_28);
  }
  return;
}

Assistant:

void CVmImageLoader::load_sini(VMG_ ulong siz)
{
    char hdr[12];
    ulong siz_rem;
    ulong hdr_siz;
    ulong init_cnt;
    ulong init_rem;
    
    /* 
     *   read the header size, static code starting offset, and
     *   initializer count 
     */
    fp_->copy_data(hdr, 12);
    hdr_siz = t3rp4u(hdr);
    static_cs_ofs_ = t3rp4u(hdr + 4);
    init_cnt = t3rp4u(hdr + 8);

    /* skip any extra header information */
    if (hdr_siz > 12)
        fp_->skip_ahead(hdr_siz - 12);

    /* account for having read the header in our size remaining */
    siz_rem = siz - hdr_siz;

    /* read in chunks of VM_STATIC_INIT_PAGE_MAX initializers */
    for (init_rem = init_cnt ; init_rem != 0 ; )
    {
        size_t cur;
        CVmStaticInitPage *pg;

        /* read the page max, or the actual number remaining if fewer */
        cur = VM_STATIC_INIT_PAGE_MAX;
        if (init_rem < cur)
            cur = (size_t)init_rem;

        /* allocate the next page */
        pg = new CVmStaticInitPage(cur);

        /* link in the page */
        if (static_tail_ != 0)
            static_tail_->nxt_ = pg;
        else
            static_head_ = pg;
        static_tail_ = pg;

        /* read the page */
        pg->data_ = fp_->alloc_and_read(cur * 6, 0, siz_rem);

        /* adjust our counters for the chunk */
        init_rem -= cur;
        siz_rem -= cur * 6;
    }

    /* skip any data we don't use in this version */
    if (siz_rem != 0)
        fp_->skip_ahead(siz_rem);
}